

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_input_sse
               (Mat *bottom_blob,Mat *bottom_blob_tm,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long *in_RSI;
  long *in_RDI;
  float r0tm5;
  float r0tm4;
  float r0tm3;
  float r0tm2;
  float r0tm1;
  float r0tm0;
  float tmp05;
  float tmp04;
  float tmp03;
  float tmp02;
  float tmp01;
  float tmp00;
  int m_3;
  float *r0_tm_5;
  float *r0_tm_4;
  float *r0_tm_3;
  float *r0_tm_2;
  float *r0_tm_1;
  float *r0_tm_0;
  float tmp5m;
  float tmp4m;
  float tmp3m;
  float tmp2m;
  float tmp1m;
  float tmp0m;
  float r05;
  float r04;
  float r03;
  float r02;
  float r01;
  float r00;
  int m_2;
  float *r0;
  int j;
  int i;
  float tmp [6] [6];
  Mat img0_tm;
  Mat img0;
  int q;
  int tiles;
  int h_tiles;
  int w_tiles;
  int inch;
  int h;
  int w;
  Mat *m_1;
  Mat *m;
  int local_384;
  float *local_380;
  float *local_378;
  float *local_370;
  float *local_368;
  float *local_360;
  float *local_358;
  int local_31c;
  float *local_318;
  int local_310;
  int local_30c;
  float local_308 [79];
  int local_1cc;
  
  iVar6 = *(int *)((long)in_RDI + 0x2c);
  lVar15 = in_RDI[7];
  iVar16 = (iVar6 + -2) / 4;
  iVar17 = ((int)in_RDI[6] + -2) / 4;
  iVar18 = iVar16 * iVar17;
  for (local_1cc = 0; local_1cc < (int)lVar15; local_1cc = local_1cc + 1) {
    iVar7 = *(int *)((long)in_RDI + 0x2c);
    lVar8 = *in_RDI;
    lVar9 = in_RDI[8];
    lVar10 = in_RDI[2];
    lVar11 = in_RDI[2];
    lVar12 = *in_RSI;
    lVar13 = in_RSI[8];
    lVar14 = in_RSI[2];
    for (local_30c = 0; local_30c < iVar17; local_30c = local_30c + 1) {
      for (local_310 = 0; local_310 < iVar16; local_310 = local_310 + 1) {
        local_318 = (float *)(lVar8 + lVar9 * local_1cc * lVar10 +
                              (long)iVar7 * (long)(local_30c << 2) * lVar11 +
                             (long)(local_310 << 2) * 4);
        for (local_31c = 0; local_31c < 6; local_31c = local_31c + 1) {
          fVar1 = local_318[1];
          fVar2 = local_318[2];
          fVar3 = local_318[3];
          fVar4 = local_318[4];
          fVar5 = local_318[5];
          local_308[local_31c] = (*local_318 * 4.0 - fVar2 * 5.0) + fVar4;
          local_308[(long)local_31c + 6] = (fVar1 + fVar2) * -4.0 + fVar4 + fVar3;
          local_308[(long)local_31c + 0xc] = ((fVar1 - fVar2) * 4.0 + fVar4) - fVar3;
          local_308[(long)local_31c + 0x12] = ((fVar1 - fVar3) * -2.0 + fVar4) - fVar2;
          local_308[(long)local_31c + 0x18] = ((fVar1 - fVar3) * 2.0 + fVar4) - fVar2;
          local_308[(long)local_31c + 0x1e] = (fVar1 * 4.0 - fVar3 * 5.0) + fVar5;
          local_318 = local_318 + iVar6;
        }
        local_358 = (float *)(lVar12 + lVar13 * local_1cc * lVar14 +
                             (long)(local_30c * iVar16 + local_310) * 4);
        local_360 = local_358 + iVar18;
        local_368 = local_358 + iVar18 * 2;
        local_370 = local_358 + iVar18 * 3;
        local_378 = local_358 + iVar18 * 4;
        local_380 = local_358 + iVar18 * 5;
        for (local_384 = 0; local_384 < 6; local_384 = local_384 + 1) {
          fVar1 = local_308[(long)local_384 * 6 + 1];
          fVar2 = local_308[(long)local_384 * 6 + 2];
          fVar3 = local_308[(long)local_384 * 6 + 3];
          fVar4 = local_308[(long)local_384 * 6 + 4];
          fVar5 = local_308[(long)local_384 * 6 + 5];
          *local_358 = (local_308[(long)local_384 * 6] * 4.0 - fVar2 * 5.0) + fVar4;
          *local_360 = (fVar1 + fVar2) * -4.0 + fVar4 + fVar3;
          *local_368 = ((fVar1 - fVar2) * 4.0 + fVar4) - fVar3;
          *local_370 = ((fVar1 - fVar3) * -2.0 + fVar4) - fVar2;
          *local_378 = ((fVar1 - fVar3) * 2.0 + fVar4) - fVar2;
          *local_380 = (fVar1 * 4.0 - fVar3 * 5.0) + fVar5;
          local_358 = local_358 + iVar18 * 6;
          local_360 = local_360 + iVar18 * 6;
          local_368 = local_368 + iVar18 * 6;
          local_370 = local_370 + iVar18 * 6;
          local_378 = local_378 + iVar18 * 6;
          local_380 = local_380 + iVar18 * 6;
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_input_sse(const Mat& bottom_blob, Mat& bottom_blob_tm, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int inch = bottom_blob.c;

    const int w_tiles = (w - 2) / 4;
    const int h_tiles = (h - 2) / 4;
    const int tiles = w_tiles * h_tiles;

    // const float itm[6][6] = {
    //     {4.0f, 0.0f, -5.0f, 0.0f, 1.0f, 0.0f},
    //     {0.0f,-4.0f, -4.0f, 1.0f, 1.0f, 0.0f},
    //     {0.0f, 4.0f, -4.0f,-1.0f, 1.0f, 0.0f},
    //     {0.0f,-2.0f, -1.0f, 2.0f, 1.0f, 0.0f},
    //     {0.0f, 2.0f, -1.0f,-2.0f, 1.0f, 0.0f},
    //     {0.0f, 4.0f,  0.0f,-5.0f, 0.0f, 1.0f}
    // };

    // 0 =  4 * r00 - 5 * r02 + r04
    // 1 = -4 * (r01 + r02) + r04 + r03
    // 2 =  4 * (r01 - r02) + r04 - r03
    // 3 = -2 * (r01 - r03) + r04 - r02
    // 4 =  2 * (r01 - r03) + r04 - r02
    // 5 =  4 * r01 - 5 * r03 + r05

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        Mat img0_tm = bottom_blob_tm.channel(q);

        float tmp[6][6];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* r0 = img0.row(i * 4) + (j * 4);

                for (int m = 0; m < 6; m++)
                {
                    float r00 = r0[0];
                    float r01 = r0[1];
                    float r02 = r0[2];
                    float r03 = r0[3];
                    float r04 = r0[4];
                    float r05 = r0[5];

                    float tmp0m = 4 * r00 - 5 * r02 + r04;
                    float tmp1m = -4 * (r01 + r02) + r04 + r03;
                    float tmp2m = 4 * (r01 - r02) + r04 - r03;
                    float tmp3m = -2 * (r01 - r03) + r04 - r02;
                    float tmp4m = 2 * (r01 - r03) + r04 - r02;
                    float tmp5m = 4 * r01 - 5 * r03 + r05;

                    tmp[0][m] = tmp0m;
                    tmp[1][m] = tmp1m;
                    tmp[2][m] = tmp2m;
                    tmp[3][m] = tmp3m;
                    tmp[4][m] = tmp4m;
                    tmp[5][m] = tmp5m;

                    r0 += w;
                }

                float* r0_tm_0 = (float*)img0_tm + (i * w_tiles + j);
                float* r0_tm_1 = r0_tm_0 + tiles;
                float* r0_tm_2 = r0_tm_0 + tiles * 2;
                float* r0_tm_3 = r0_tm_0 + tiles * 3;
                float* r0_tm_4 = r0_tm_0 + tiles * 4;
                float* r0_tm_5 = r0_tm_0 + tiles * 5;

                for (int m = 0; m < 6; m++)
                {
                    float tmp00 = tmp[m][0];
                    float tmp01 = tmp[m][1];
                    float tmp02 = tmp[m][2];
                    float tmp03 = tmp[m][3];
                    float tmp04 = tmp[m][4];
                    float tmp05 = tmp[m][5];

                    float r0tm0 = 4 * tmp00 - 5 * tmp02 + tmp04;
                    float r0tm1 = -4 * (tmp01 + tmp02) + tmp04 + tmp03;
                    float r0tm2 = 4 * (tmp01 - tmp02) + tmp04 - tmp03;
                    float r0tm3 = -2 * (tmp01 - tmp03) + tmp04 - tmp02;
                    float r0tm4 = 2 * (tmp01 - tmp03) + tmp04 - tmp02;
                    float r0tm5 = 4 * tmp01 - 5 * tmp03 + tmp05;

                    r0_tm_0[0] = r0tm0;
                    r0_tm_1[0] = r0tm1;
                    r0_tm_2[0] = r0tm2;
                    r0_tm_3[0] = r0tm3;
                    r0_tm_4[0] = r0tm4;
                    r0_tm_5[0] = r0tm5;

                    r0_tm_0 += tiles * 6;
                    r0_tm_1 += tiles * 6;
                    r0_tm_2 += tiles * 6;
                    r0_tm_3 += tiles * 6;
                    r0_tm_4 += tiles * 6;
                    r0_tm_5 += tiles * 6;
                }
            }
        }
    }
}